

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfg_tobin.c
# Opt level: O0

int cfg_tobin_netaddr(void *reference,size_t bin_size,const_strarray *value)

{
  netaddr *ptr;
  const_strarray *value_local;
  size_t bin_size_local;
  void *reference_local;
  
  if (bin_size == 0x12) {
    reference_local._4_4_ = netaddr_from_string((netaddr *)reference,value->value);
  }
  else {
    reference_local._4_4_ = -1;
  }
  return reference_local._4_4_;
}

Assistant:

int
cfg_tobin_netaddr(void *reference, size_t bin_size, const struct const_strarray *value) {
  struct netaddr *ptr;

  if (bin_size != sizeof(*ptr)) {
    return -1;
  }

  ptr = (struct netaddr *)reference;

  return netaddr_from_string(ptr, strarray_get_first_c(value));
}